

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_SimpleArray<ON_2dPoint> *
ON_LiftToCover(ON_SimpleArray<ON_2dPoint> *__return_storage_ptr__,ON_SimpleArray<ON_2dPoint> *in,
              ON_Interval *dom,bool *closed,double normband)

{
  int iVar1;
  int iVar2;
  ON_2dPoint *pOVar3;
  ON_2dPoint OVar4;
  ON_2dPoint local_a0 [2];
  int local_80;
  undefined1 local_79;
  int i;
  ON_PeriodicDomain Cover;
  double normband_local;
  bool *closed_local;
  ON_Interval *dom_local;
  ON_SimpleArray<ON_2dPoint> *in_local;
  ON_SimpleArray<ON_2dPoint> *out;
  
  Cover.m_nprev.y = normband;
  ON_PeriodicDomain::ON_PeriodicDomain((ON_PeriodicDomain *)&i,dom,closed,normband);
  local_79 = 0;
  iVar1 = ON_SimpleArray<ON_2dPoint>::Count(in);
  ON_SimpleArray<ON_2dPoint>::ON_SimpleArray(__return_storage_ptr__,(long)iVar1);
  for (local_80 = 0; iVar1 = local_80, iVar2 = ON_SimpleArray<ON_2dPoint>::Count(in), iVar1 < iVar2;
      local_80 = local_80 + 1) {
    pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[](in,local_80);
    OVar4 = ON_PeriodicDomain::LiftToCover((ON_PeriodicDomain *)&i,*pOVar3,false);
    local_a0[0].y = OVar4.y;
    local_a0[0].x = OVar4.x;
    ON_SimpleArray<ON_2dPoint>::Append(__return_storage_ptr__,local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_SimpleArray<ON_2dPoint> ON_LiftToCover(
	const ON_SimpleArray<ON_2dPoint>& in,
	const ON_Interval dom[2], bool closed[2],
	double normband)
{
	ON_PeriodicDomain Cover(dom, closed, normband);
	ON_SimpleArray<ON_2dPoint> out(in.Count());
	for (int i = 0; i < in.Count(); i++)
		out.Append(Cover.LiftToCover(in[i]));

	return out;
}